

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::OptionNotFound::OptionNotFound(OptionNotFound *this,string *msg,ExitCodes exit_code)

{
  string *in_RSI;
  undefined8 *in_RDI;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [4];
  ExitCodes in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  Error *in_stack_ffffffffffffffe0;
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ::std::__cxx11::string::string(local_70,in_RSI);
  Error::Error(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator(&local_39);
  *in_RDI = &PTR__OptionNotFound_0037b660;
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}